

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_filter.cpp
# Opt level: O1

ScalarFunction * duckdb::ListFilterFun::GetFunction(void)

{
  LogicalType varargs;
  long lVar1;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffeec;
  FunctionNullHandling in_stack_fffffffffffffef8;
  bind_lambda_function_t in_stack_ffffffffffffff00;
  scalar_function_t local_f8;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  LogicalType local_70 [3];
  
  LogicalType::LogicalType(&local_a0,ANY);
  LogicalType::LIST(local_70,&local_a0);
  LogicalType::LogicalType(local_70 + 1,LAMBDA);
  __l._M_len = 2;
  __l._M_array = local_70;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_88,__l,(allocator_type *)&stack0xffffffffffffff07);
  LogicalType::LogicalType(&local_d0,ANY);
  LogicalType::LIST(&local_b8,&local_d0);
  local_f8.super__Function_base._M_functor._8_8_ = 0;
  local_f8.super__Function_base._M_functor._M_unused._M_object = LambdaFunctions::ListFilterFunction
  ;
  local_f8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_f8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(local_70 + 2,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = local_70 + 2;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffee4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffeec;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_88,&local_b8,&local_f8,
             ListFilterBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffef8,
             in_stack_ffffffffffffff00);
  LogicalType::~LogicalType(local_70 + 2);
  if (local_f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f8.super__Function_base._M_manager)
              ((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_b8);
  LogicalType::~LogicalType(&local_d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_70[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_a0);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->serialize = ListLambdaBindData::Serialize;
  in_RDI->deserialize = ListLambdaBindData::Deserialize;
  in_RDI->bind_lambda = ListFilterBindLambda;
  return in_RDI;
}

Assistant:

ScalarFunction ListFilterFun::GetFunction() {
	ScalarFunction fun({LogicalType::LIST(LogicalType::ANY), LogicalType::LAMBDA}, LogicalType::LIST(LogicalType::ANY),
	                   LambdaFunctions::ListFilterFunction, ListFilterBind, nullptr, nullptr);

	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = ListLambdaBindData::Serialize;
	fun.deserialize = ListLambdaBindData::Deserialize;
	fun.bind_lambda = ListFilterBindLambda;

	return fun;
}